

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int mp_init_multi(mp_int *mp,...)

{
  char in_AL;
  mp_digit *pmVar1;
  void **ppvVar2;
  void **ppvVar3;
  uint uVar4;
  undefined8 in_RCX;
  ulong uVar5;
  undefined8 in_RDX;
  mp_int *pmVar6;
  int iVar7;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list clean_args;
  va_list args;
  void **local_120;
  void **local_100;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_100 = &clean_args[0].overflow_arg_area;
  uVar4 = 8;
  if (mp != (mp_int *)0x0) {
    iVar7 = 0;
    pmVar6 = mp;
    local_e8[1] = (void *)in_RSI;
    local_e8[2] = (void *)in_RDX;
    local_e8[3] = (void *)in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    do {
      pmVar1 = (mp_digit *)calloc(1,0x100);
      pmVar6->dp = pmVar1;
      if (pmVar1 == (mp_digit *)0x0) {
        uVar4 = 8;
        ppvVar2 = &clean_args[0].overflow_arg_area;
        for (; iVar7 != 0; iVar7 = iVar7 + 1) {
          if (mp->dp != (mp_digit *)0x0) {
            free(mp->dp);
            mp->dp = (mp_digit *)0x0;
            mp->used = 0;
            mp->alloc = 0;
            mp->sign = 0;
          }
          uVar5 = (ulong)uVar4;
          if (uVar5 < 0x29) {
            uVar4 = uVar4 + 8;
            ppvVar3 = (void **)((long)local_e8 + uVar5);
            local_120 = ppvVar2;
          }
          else {
            local_120 = ppvVar2 + 1;
            ppvVar3 = ppvVar2;
          }
          mp = (mp_int *)*ppvVar3;
          ppvVar2 = local_120;
        }
        return -2;
      }
      pmVar6->used = 0;
      pmVar6->alloc = 0x20;
      pmVar6->sign = 0;
      uVar5 = (ulong)uVar4;
      if (uVar5 < 0x29) {
        uVar4 = uVar4 + 8;
        ppvVar2 = (void **)((long)local_e8 + uVar5);
      }
      else {
        ppvVar2 = local_100;
        local_100 = local_100 + 1;
      }
      pmVar6 = (mp_int *)*ppvVar2;
      iVar7 = iVar7 + -1;
    } while (pmVar6 != (mp_int *)0x0);
  }
  return 0;
}

Assistant:

int mp_init_multi(mp_int *mp, ...) 
{
    mp_err res = MP_OKAY;      /* Assume ok until proven otherwise */
    int n = 0;                 /* Number of ok inits */
    mp_int* cur_arg = mp;
    va_list args;

    va_start(args, mp);        /* init args to next argument from caller */
    while (cur_arg != NULL) {
        if (mp_init(cur_arg) != MP_OKAY) {
            /* Oops - error! Back-track and mp_clear what we already
               succeeded in init-ing, then return error.
            */
            va_list clean_args;
            
            /* end the current list */
            va_end(args);
            
            /* now start cleaning up */            
            cur_arg = mp;
            va_start(clean_args, mp);
            while (n--) {
                mp_clear(cur_arg);
                cur_arg = va_arg(clean_args, mp_int*);
            }
            va_end(clean_args);
            res = MP_MEM;
            break;
        }
        n++;
        cur_arg = va_arg(args, mp_int*);
    }
    va_end(args);
    return res;                /* Assumed ok, if error flagged above. */
}